

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall QProcessEnvironment::insert(QProcessEnvironment *this,QString *name,QString *value)

{
  QProcessEnvironmentPrivate *pQVar1;
  QProcessEnvironmentPrivate *this_00;
  long in_FS_OFFSET;
  QProcEnvValue local_70;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QSharedDataPointer<QProcessEnvironmentPrivate>::detach(&this->d);
  pQVar1 = QSharedDataPointer<QProcessEnvironmentPrivate>::operator->(&this->d);
  this_00 = QSharedDataPointer<QProcessEnvironmentPrivate>::operator->(&this->d);
  QProcessEnvironmentPrivate::prepareName((Key *)&local_40,this_00,name);
  QSharedDataPointer<QProcessEnvironmentPrivate>::operator->(&this->d);
  QProcEnvValue::QProcEnvValue(&local_70,value);
  QMap<QByteArray,_QProcEnvValue>::insert(&pQVar1->vars,(QByteArray *)&local_40,&local_70);
  QProcEnvValue::~QProcEnvValue(&local_70);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcessEnvironment::insert(const QString &name, const QString &value)
{
    // our re-impl of detach() detaches from null
    d.detach(); // detach before prepareName()
    d->vars.insert(d->prepareName(name), d->prepareValue(value));
}